

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_mul_2d(mp_int *a,int b,mp_int *c)

{
  ulong uVar1;
  byte bVar2;
  mp_int *in_RDX;
  int in_ESI;
  mp_int *in_RDI;
  int x;
  mp_digit rr;
  mp_digit r;
  mp_digit mask;
  mp_digit shift;
  mp_digit *tmpc;
  int res;
  mp_digit d;
  int in_stack_ffffffffffffffa4;
  int iVar3;
  mp_int *in_stack_ffffffffffffffa8;
  mp_int *in_stack_ffffffffffffffb0;
  ulong uVar4;
  mp_int *in_stack_ffffffffffffffb8;
  ulong *local_38;
  int local_4;
  
  if ((((in_RDI == in_RDX) ||
       (local_4 = mp_copy(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0), local_4 == 0)) &&
      ((iVar3 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
       in_RDX->used + in_ESI / 0x3c + 1 <= in_RDX->alloc ||
       (local_4 = mp_grow(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4), local_4 == 0)))) &&
     ((in_ESI < 0x3c || (local_4 = mp_lshd(in_stack_ffffffffffffffb8,iVar3), local_4 == 0)))) {
    if (in_ESI % 0x3c != 0) {
      bVar2 = (byte)(in_ESI % 0x3c);
      local_38 = in_RDX->dp;
      uVar4 = 0;
      for (iVar3 = 0; iVar3 < in_RDX->used; iVar3 = iVar3 + 1) {
        uVar1 = *local_38;
        *local_38 = (*local_38 << (bVar2 & 0x3f) | uVar4) & 0xfffffffffffffff;
        local_38 = local_38 + 1;
        uVar4 = uVar1 >> (0x3c - bVar2 & 0x3f) & (1L << (bVar2 & 0x3f)) - 1U;
      }
      if (uVar4 != 0) {
        iVar3 = in_RDX->used;
        in_RDX->used = iVar3 + 1;
        in_RDX->dp[iVar3] = uVar4;
      }
    }
    mp_clamp(in_RDX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mp_mul_2d (mp_int * a, int b, mp_int * c)
{
  mp_digit d;
  int      res;

  /* copy */
  if (a != c) {
     if ((res = mp_copy (a, c)) != MP_OKAY) {
       return res;
     }
  }

  if (c->alloc < (int)(c->used + b/DIGIT_BIT + 1)) {
     if ((res = mp_grow (c, c->used + b / DIGIT_BIT + 1)) != MP_OKAY) {
       return res;
     }
  }

  /* shift by as many digits in the bit count */
  if (b >= (int)DIGIT_BIT) {
    if ((res = mp_lshd (c, b / DIGIT_BIT)) != MP_OKAY) {
      return res;
    }
  }

  /* shift any bit count < DIGIT_BIT */
  d = (mp_digit) (b % DIGIT_BIT);
  if (d != 0) {
    register mp_digit *tmpc, shift, mask, r, rr;
    register int x;

    /* bitmask for carries */
    mask = (((mp_digit)1) << d) - 1;

    /* shift for msbs */
    shift = DIGIT_BIT - d;

    /* alias */
    tmpc = c->dp;

    /* carry */
    r    = 0;
    for (x = 0; x < c->used; x++) {
      /* get the higher bits of the current word */
      rr = (*tmpc >> shift) & mask;

      /* shift the current word and OR in the carry */
      *tmpc = ((*tmpc << d) | r) & MP_MASK;
      ++tmpc;

      /* set the carry to the carry bits of the current word */
      r = rr;
    }
    
    /* set final carry */
    if (r != 0) {
       c->dp[(c->used)++] = r;
    }
  }
  mp_clamp (c);
  return MP_OKAY;
}